

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

iterator __thiscall
fmt::v5::internal::
arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>::
operator()(arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>
           *this,basic_string_view<char> value)

{
  char cVar1;
  char *pcVar2;
  ulong uVar3;
  size_t sVar4;
  ulong uVar5;
  undefined8 extraout_RDX;
  undefined8 uVar6;
  counting_iterator<char> *it;
  format_specs *spec;
  _Distance __n;
  char *data;
  iterator iVar7;
  str_writer<char> local_28;
  
  uVar5 = value.size_;
  spec = this->specs_;
  if (spec == (format_specs *)0x0) {
    pcVar2 = &(this->writer_).out_.blackhole_;
    uVar3 = 0;
    if (0 < (long)uVar5) {
      uVar3 = uVar5;
      pcVar2 = value.data_ + (uVar5 - 1);
    }
    sVar4 = uVar3 + (this->writer_).out_.count_;
    cVar1 = *pcVar2;
    uVar6 = CONCAT71((int7)((ulong)pcVar2 >> 8),cVar1);
    (this->writer_).out_.count_ = sVar4;
    (this->writer_).out_.blackhole_ = cVar1;
  }
  else {
    cVar1 = (spec->super_core_format_specs).type;
    if ((cVar1 != '\0') && (cVar1 != 's')) {
      error_handler::on_error((error_handler *)&local_28,"invalid type specifier");
      spec = this->specs_;
    }
    uVar3 = (ulong)(spec->super_core_format_specs).precision;
    local_28.size_ = uVar5;
    if (uVar3 < uVar5) {
      local_28.size_ = uVar3;
    }
    if ((long)uVar3 < 0) {
      local_28.size_ = uVar5;
    }
    local_28.s = value.data_;
    basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>::
    write_padded<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>::str_writer<char>>
              ((basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>
                *)this,&spec->super_align_spec,&local_28);
    sVar4 = (this->writer_).out_.count_;
    uVar6 = CONCAT71((int7)((ulong)extraout_RDX >> 8),(this->writer_).out_.blackhole_);
  }
  iVar7._8_8_ = uVar6;
  iVar7.count_ = sVar4;
  return iVar7;
}

Assistant:

iterator operator()(basic_string_view<char_type> value) {
    if (specs_) {
      internal::check_string_type_spec(
            specs_->type, internal::error_handler());
      writer_.write(value, *specs_);
    } else {
      writer_.write(value);
    }
    return out();
  }